

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

complex<long_double> * __thiscall
TPZMatrix<std::complex<long_double>_>::ConditionNumber
          (complex<long_double> *__return_storage_ptr__,TPZMatrix<std::complex<long_double>_> *this,
          int p,int64_t numiter,REAL tol)

{
  int iVar1;
  ostream *poVar2;
  complex<long_double> thisnorm;
  complex<long_double> invnorm;
  TPZFMatrix<std::complex<long_double>_> Inv;
  complex<long_double> local_f8;
  complex<long_double> local_d8;
  TPZFMatrix<std::complex<long_double>_> local_b0;
  
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(&local_b0);
  MatrixNorm(&local_f8,this,p,numiter,tol);
  iVar1 = Inverse(this,&local_b0,ENoDecompose);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TVar TPZMatrix<std::complex<long double>>::ConditionNumber(int, int64_t, REAL) [T = std::complex<long double>]"
                            );
    poVar2 = std::operator<<(poVar2," - it was not possible to compute the inverse matrix.");
    std::endl<char,std::char_traits<char>>(poVar2);
    *(longdouble *)__return_storage_ptr__->_M_value = (longdouble)0;
    *(longdouble *)(__return_storage_ptr__->_M_value + 0x10) = (longdouble)0;
  }
  else {
    MatrixNorm(&local_d8,&local_b0.super_TPZMatrix<std::complex<long_double>_>,p,numiter,tol);
    *(undefined8 *)(__return_storage_ptr__->_M_value + 0x10) = local_f8._M_value._16_8_;
    *(undefined8 *)(__return_storage_ptr__->_M_value + 0x18) = local_f8._M_value._24_8_;
    *(undefined8 *)__return_storage_ptr__->_M_value = local_f8._M_value._0_8_;
    *(undefined8 *)(__return_storage_ptr__->_M_value + 8) = local_f8._M_value._8_8_;
    std::complex<long_double>::operator*=(__return_storage_ptr__,&local_d8);
  }
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}